

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp1.c
# Opt level: O3

void Putchar(Global *global,int c)

{
  if (global->out == '\0') {
    return;
  }
  if (global->output != (_func_void_int_void_ptr *)0x0) {
    (*global->output)(c,global->userdata);
    return;
  }
  putchar(c);
  return;
}

Assistant:

void Putchar(struct Global *global, int c)
{
  /*
   * Output one character to stdout or to output function!
   */
  if(!global->out)
    return;
#if defined(unix)
  if(global->output)
    global->output(c, global->userdata);
  else
    putchar(c);
#else /* amiga */
  global->output(c, global->userdata);
#endif
}